

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::MarbleTexture::Evaluate(MarbleTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  float fVar1;
  Float FVar2;
  undefined1 auVar3 [16];
  int iVar4;
  size_t extraout_RDX;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  float fVar11;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar12 [56];
  undefined1 auVar10 [64];
  undefined1 in_register_000013c4 [12];
  span<const_pbrt::RGB> cp;
  Point3f PVar13;
  RGB RVar14;
  SampledSpectrum SVar15;
  Vector3f dpdx;
  Vector3f dpdy;
  undefined8 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined8 *local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined1 local_b0 [16];
  undefined8 **local_a0;
  undefined1 local_98 [16];
  undefined8 uStack_88;
  undefined1 auStack_80 [16];
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_f8[0] = &local_c0;
  local_d8 = &local_d0;
  local_b0._0_8_ = local_98;
  local_b0._8_8_ = local_f8;
  local_a0 = &local_d8;
  local_c0 = 0;
  local_d0 = 0;
  local_b8 = 0.0;
  local_c8 = 0.0;
  local_98._0_4_ = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_98._4_4_ = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_98._8_4_ = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_98._12_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_88._0_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_88._4_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  auStack_80._0_4_ = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  auStack_80._4_4_ = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  auStack_80._8_4_ = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  auStack_80._12_4_ = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  uStack_70._0_4_ = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  uStack_70._4_4_ = ctx.dudx;
  uStack_68._0_4_ = ctx.dudy;
  uStack_68._4_4_ = ctx.dvdx;
  uStack_60._0_4_ = ctx.dvdy;
  uStack_60._4_4_ = ctx.faceIndex;
  PVar13 = const::{lambda(auto:1)#1}::operator()
                     ((_lambda_auto_1__1_ *)local_b0,
                      (TransformMapping3D *)
                      ((this->mapping).super_TaggedPointer<pbrt::TransformMapping3D>.bits &
                      0xffffffffffff));
  fVar1 = this->scale;
  fVar6 = PVar13.super_Tuple3<pbrt::Point3,_float>.x * fVar1;
  fVar11 = PVar13.super_Tuple3<pbrt::Point3,_float>.y * fVar1;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.x = fVar1 * (float)local_d0;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.y = fVar1 * (float)((ulong)local_d0 >> 0x20);
  local_e8 = vmovshdup_avx(CONCAT412(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x * fVar1,
                                     CONCAT48(ctx.p.super_Tuple3<pbrt::Point3,_float>.z * fVar1,
                                              CONCAT44(fVar11,fVar6))));
  FVar2 = this->variation;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.x = fVar1 * (float)local_c0;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.y = fVar1 * (float)((ulong)local_c0 >> 0x20);
  PVar13.super_Tuple3<pbrt::Point3,_float>.z = PVar13.super_Tuple3<pbrt::Point3,_float>.z * fVar1;
  PVar13.super_Tuple3<pbrt::Point3,_float>.x = fVar6;
  PVar13.super_Tuple3<pbrt::Point3,_float>.y = fVar11;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 * local_b8;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 * local_c8;
  auVar8._0_4_ = FBm(PVar13,dpdx,dpdy,this->omega,this->octaves);
  auVar8._4_60_ = extraout_var;
  auVar5 = vfmadd213ss_fma(auVar8._0_16_,ZEXT416((uint)FVar2),ZEXT416((uint)local_e8._0_4_));
  auVar9._0_4_ = sinf(auVar5._0_4_);
  auVar9._4_60_ = extraout_var_00;
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),auVar9._0_16_,
                           SUB6416(ZEXT464(0x3f000000),0));
  local_98._0_8_ = 0x3f147ae13f147ae1;
  local_98._8_8_ = 0x3f147ae13f19999a;
  uStack_88 = 0x3f19999a3f147ae1;
  auStack_80._0_8_ = 0x3f147ae13f147ae1;
  auStack_80._8_8_ = 0x3f0000003f19999a;
  uStack_70 = 0x3f0000003f000000;
  uStack_68 = 0x3f170a3d3f19999a;
  uStack_60 = 0x3f147ae13f147ae1;
  auVar5._8_4_ = 0x3f147ae1;
  auVar5._0_8_ = 0x3f147ae13f147ae1;
  auVar5._12_4_ = 0x3f147ae1;
  local_58 = 0x3f19999a3f147ae1;
  uStack_50 = 0x3f147ae13f147ae1;
  uStack_48 = 0x3e4ccccd3f19999a;
  uStack_40 = 0x3ea8f5c33e4ccccd;
  local_38 = vmovlps_avx(auVar5);
  local_30 = 0x3f19999a;
  auVar5 = ZEXT416((uint)(auVar3._0_4_ * 6.0));
  auVar5 = vroundss_avx(auVar5,auVar5,9);
  iVar4 = 5;
  if ((int)auVar5._0_4_ < 5) {
    iVar4 = (int)auVar5._0_4_;
  }
  auVar7._0_4_ = (float)iVar4;
  auVar7._4_12_ = in_register_000013c4;
  auVar5 = vfmsub231ss_fma(auVar7,SUB6416(ZEXT464(0x40c00000),0),auVar3);
  auVar12 = ZEXT856(auVar5._8_8_);
  cp.n = extraout_RDX;
  cp.ptr = (RGB *)0x4;
  RVar14 = EvaluateCubicBezier<pbrt::RGB>((pbrt *)(local_98 + (long)iVar4 * 0xc),cp,auVar5._0_4_);
  auVar10._0_8_ = RVar14._0_8_;
  auVar10._8_56_ = auVar12;
  auVar3._8_4_ = 0x3fc00000;
  auVar3._0_8_ = 0x3fc000003fc00000;
  auVar3._12_4_ = 0x3fc00000;
  auVar5 = vmulps_avx512vl(auVar10._0_16_,auVar3);
  local_b0._0_8_ = vmovlps_avx(auVar5);
  local_b0._8_4_ = RVar14.b * 1.5;
  RGBAlbedoSpectrum::RGBAlbedoSpectrum
            ((RGBAlbedoSpectrum *)local_f8,RGBColorSpace::sRGB,(RGB *)local_b0);
  SVar15 = RGBAlbedoSpectrum::Sample((RGBAlbedoSpectrum *)local_f8,&lambda);
  return (array<float,_4>)(array<float,_4>)SVar15;
}

Assistant:

SampledSpectrum MarbleTexture::Evaluate(TextureEvalContext ctx,
                                        SampledWavelengths lambda) const {
    Vector3f dpdx, dpdy;
    Point3f p = mapping.Map(ctx, &dpdx, &dpdy);
    p *= scale;
    Float marble = p.y + variation * FBm(p, scale * dpdx, scale * dpdy, omega, octaves);
    Float t = .5f + .5f * std::sin(marble);
    // Evaluate marble spline at $t$ to compute color _rgb_
    const RGB c[] = {
        {.58f, .58f, .6f}, {.58f, .58f, .6f}, {.58f, .58f, .6f},
        {.5f, .5f, .5f},   {.6f, .59f, .58f}, {.58f, .58f, .6f},
        {.58f, .58f, .6f}, {.2f, .2f, .33f},  {.58f, .58f, .6f},
    };
    int nSeg = PBRT_ARRAYSIZE(c) - 3;
    int first = std::min<int>(std::floor(t * nSeg), nSeg - 1);
    t = t * nSeg - first;
    RGB rgb = 1.5f * EvaluateCubicBezier(pstd::span(c + first, 4), t);

#ifdef PBRT_IS_GPU_CODE
    return RGBAlbedoSpectrum(*RGBColorSpace_sRGB, rgb).Sample(lambda);
#else
    return RGBAlbedoSpectrum(*RGBColorSpace::sRGB, rgb).Sample(lambda);
#endif
}